

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O0

void __thiscall
stackjit::ByteCodeParser::parseAttribute(ByteCodeParser *this,AttributeContainer *container)

{
  bool bVar1;
  size_type sVar2;
  runtime_error *prVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar4;
  size_type sVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>
  local_2e0;
  undefined1 local_261;
  char local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1e0;
  undefined1 local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  undefined1 local_190 [8];
  string value;
  ByteCodeParser local_170;
  undefined1 local_148 [8];
  string key;
  string local_128 [32];
  undefined1 local_108 [8];
  Attribute attribute;
  char local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [48];
  undefined1 local_58 [40];
  string attributeName;
  AttributeContainer *container_local;
  ByteCodeParser *this_local;
  
  nextToken_abi_cxx11_((ByteCodeParser *)(local_58 + 0x20));
  nextToken_abi_cxx11_((ByteCodeParser *)local_58);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"(");
  std::__cxx11::string::~string((string *)local_58);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Expected \'(\' after attribute name");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
          ::count(container,(key_type *)(local_58 + 0x20));
  if (sVar2 != 0) {
    attribute.mValues._M_h._M_single_bucket._7_1_ = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "The attribute \'");
    std::operator+(local_88,local_a8);
    std::runtime_error::runtime_error(prVar3,(string *)local_88);
    attribute.mValues._M_h._M_single_bucket._7_1_ = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_128,(string *)(local_58 + 0x20));
  Loader::Attribute::Attribute((Attribute *)local_108,(string *)local_128);
  std::__cxx11::string::~string(local_128);
  do {
    nextToken_abi_cxx11_((ByteCodeParser *)local_148);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_148,")");
    if (bVar1) {
      local_170._36_4_ = 3;
    }
    else {
      nextToken_abi_cxx11_(&local_170);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_170,"=");
      std::__cxx11::string::~string((string *)&local_170);
      if (bVar1) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Expected \'=\' after name in attribute.");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      nextToken_abi_cxx11_((ByteCodeParser *)local_190);
      puVar4 = Loader::Attribute::values_abi_cxx11_((Attribute *)local_108);
      sVar5 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(puVar4,(key_type *)local_148);
      if (sVar5 != 0) {
        local_261 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_260,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "The key \'");
        std::operator+(local_240,local_260);
        std::operator+(local_220,local_240);
        std::operator+(local_200,(char *)local_220);
        std::runtime_error::runtime_error(prVar3,(string *)local_200);
        local_261 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar4 = Loader::Attribute::values_abi_cxx11_((Attribute *)local_108);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
      pVar6 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::insert(puVar4,&local_1d0);
      local_1e0._M_cur =
           (__node_type *)
           pVar6.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
           ._M_cur;
      local_1d8 = pVar6.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_1d0);
      std::__cxx11::string::~string((string *)local_190);
      local_170._36_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_148);
    if (local_170._36_4_ != 0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_stackjit::Loader::Attribute_&,_true>
                (&local_2e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_58 + 0x20),(Attribute *)local_108);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
      ::insert(container,&local_2e0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>
      ::~pair(&local_2e0);
      Loader::Attribute::~Attribute((Attribute *)local_108);
      std::__cxx11::string::~string((string *)(local_58 + 0x20));
      return;
    }
  } while( true );
}

Assistant:

void ByteCodeParser::parseAttribute(Loader::AttributeContainer& container) {
		auto attributeName = nextToken();

		if (nextToken() != "(") {
			throw std::runtime_error("Expected '(' after attribute name");
		}

		if (container.count(attributeName) > 0) {
			throw std::runtime_error("The attribute '" + attributeName + "' is already defined.'");
		}

		Loader::Attribute attribute(attributeName);

		while (true) {
			auto key = nextToken();

			if (key == ")") {
				break;
			}

			if (nextToken() != "=") {
				throw std::runtime_error("Expected '=' after name in attribute.");
			}

			auto value = nextToken();

			if (attribute.values().count(key) == 0) {
				attribute.values().insert({key, value});
			} else {
				throw std::runtime_error("The key '" + key + "' is already defined in the attribute '" + attributeName + "'.");
			}
		}

		container.insert({attributeName, attribute});
	}